

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  size_t count;
  long lVar1;
  Maybe<capnp::schema::Node::Reader> *pMVar2;
  int iVar3;
  Schema SVar4;
  Reader *pRVar5;
  Exception *params_1;
  char *pcVar6;
  Reader *reader;
  Exception *reader_00;
  StringPtr error;
  Reader local_538;
  Array<capnp::Schema> result;
  Schema local_4f0;
  NullableValue<kj::Exception> local_4e8;
  NullableValue<kj::Exception> _exception655;
  
  getContent((Node *)&_exception655,(State)this);
  lVar1 = CONCAT71(_exception655._1_7_,_exception655.isSet);
  if (lVar1 != 0) {
    params_1 = (Exception *)(lVar1 + 0xa8);
    reader_00 = (Exception *)0x0;
    if (*(char *)(lVar1 + 0xa0) != '\0') {
      reader_00 = params_1;
    }
    if (*(char *)(lVar1 + 0xa0) == '\x01') {
      count = *(size_t *)(lVar1 + 0xe0);
      local_538._reader.capTable =
           (CapTableReader *)kj::_::HeapArrayDisposer::allocateUninitialized<capnp::Schema>(count);
      local_538._reader.data = ((Exception *)local_538._reader.capTable)->trace + (count - 0xd);
      local_538._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
      pRVar5 = *(Reader **)(lVar1 + 0xd8);
      local_538._reader.segment = (SegmentReader *)local_538._reader.capTable;
      for (reader = pRVar5; params_1 = (Exception *)local_538._reader.segment,
          reader != pRVar5 + *(long *)(lVar1 + 0xe0); reader = reader + 1) {
        SVar4 = SchemaLoader::loadOnce(loader,reader);
        (((String *)&(local_538._reader.capTable)->_vptr_CapTableReader)->content).ptr =
             (char *)SVar4.raw;
        local_538._reader.capTable =
             (CapTableReader *)
             &(((String *)&(local_538._reader.capTable)->_vptr_CapTableReader)->content).size_;
        pRVar5 = *(Reader **)(lVar1 + 0xd8);
      }
      result.size_ = (long)local_538._reader.capTable - (long)local_538._reader.segment >> 3;
      result.ptr = (Schema *)local_538._reader.segment;
      result.disposer = (ArrayDisposer *)local_538._reader.pointers;
      local_538._reader.segment = (SegmentReader *)0x0;
      local_538._reader.capTable = (CapTableReader *)0x0;
      local_538._reader.data = (Schema *)0x0;
      kj::ArrayBuilder<capnp::Schema>::dispose((ArrayBuilder<capnp::Schema> *)&local_538);
      kj::Array<capnp::Schema>::~Array(&result);
      local_4f0 = SchemaLoader::loadOnce(loader,(Reader *)reader_00);
      Schema::getProto(&local_538,&local_4f0);
      if ((this->loadedFinalSchema).ptr.isSet == true) {
        (this->loadedFinalSchema).ptr.isSet = false;
      }
      pMVar2 = &this->loadedFinalSchema;
      *(StructDataBitCount *)((long)&(pMVar2->ptr).field_1 + 0x20) = local_538._reader.dataSize;
      *(StructPointerCount *)((long)&(pMVar2->ptr).field_1 + 0x24) = local_538._reader.pointerCount;
      *(undefined2 *)((long)&(pMVar2->ptr).field_1 + 0x26) = local_538._reader._38_2_;
      *(int *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x28) = local_538._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x2c) =
           local_538._reader._44_4_;
      (this->loadedFinalSchema).ptr.field_1.value._reader.data = local_538._reader.data;
      (this->loadedFinalSchema).ptr.field_1.value._reader.pointers = local_538._reader.pointers;
      (this->loadedFinalSchema).ptr.field_1.value._reader.segment = local_538._reader.segment;
      (this->loadedFinalSchema).ptr.field_1.value._reader.capTable = local_538._reader.capTable;
      (this->loadedFinalSchema).ptr.isSet = true;
    }
    local_4e8.isSet = false;
    kj::_::NullableValue<kj::Exception>::NullableValue(&_exception655,&local_4e8);
    kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4e8);
    if (_exception655.isSet == true) {
      if (*(char *)(lVar1 + 0xa0) == '\x01') {
        *(undefined1 *)(lVar1 + 0xa0) = 0;
      }
      iVar3 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar3 == '\0') {
        kj::str<char_const(&)[50],kj::Exception&>
                  ((String *)&local_4e8,(kj *)"Internal compiler bug: Schema failed validation:\n",
                   (char (*) [50])&_exception655.field_1,params_1);
        if (local_4e8.field_1.value.ownFile.content.ptr == (char *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (char *)CONCAT71(local_4e8._1_7_,local_4e8.isSet);
        }
        error.content.size_ =
             local_4e8.field_1.value.ownFile.content.ptr +
             (local_4e8.field_1.value.ownFile.content.ptr == (char *)0x0);
        error.content.ptr = pcVar6;
        addError(this,error);
        kj::Array<char>::~Array((Array<char> *)&local_4e8);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue(&_exception655);
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        KJ_MAP(auxSchema, content.auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content.finalSchema = kj::none;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", exception));
      }
    }
  }
}